

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManUpdate(Dam_Man_t *p,int iDiv)

{
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar1;
  Vec_Flt_t *pVVar2;
  uint Lit;
  uint Lit_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iLit1;
  int LevR;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int local_5c;
  
  p_00 = p->pGia->vSuper;
  Lit = Hash_IntObjData0(p->vHash,iDiv);
  Lit_00 = Hash_IntObjData1(p->vHash,iDiv);
  piVar9 = Dam_DivSet(p,iDiv);
  pGVar1 = p->pGia;
  pGVar10 = Gia_ManAppendObj(pGVar1);
  if ((int)Lit_00 < (int)Lit) {
    if (((int)Lit < 0) || (iVar3 = Abc_Lit2Var(Lit), pGVar1->nObjs <= iVar3)) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    if (((int)Lit_00 < 0) || (iVar3 = Abc_Lit2Var(Lit_00), pGVar1->nObjs <= iVar3)) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    iVar3 = Abc_Lit2Var(Lit);
    iVar4 = Abc_Lit2Var(Lit_00);
    if (iVar3 == iVar4) {
      __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    uVar5 = Abc_Lit2Var(Lit);
    uVar6 = Abc_Lit2Var(Lit_00);
    iVar3 = Gia_ObjId(pGVar1,pGVar10);
    iVar4 = Abc_Lit2Var(Lit);
    uVar11 = (ulong)(iVar3 - iVar4 & 0x1fffffff);
    if (uVar6 < uVar5) {
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffe0000000 | uVar11;
      iVar3 = Abc_LitIsCompl(Lit);
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
      iVar3 = Gia_ObjId(pGVar1,pGVar10);
      iVar4 = Abc_Lit2Var(Lit_00);
      *(ulong *)pGVar10 =
           *(ulong *)pGVar10 & 0xe0000000ffffffff | (ulong)(iVar3 - iVar4 & 0x1fffffff) << 0x20;
      uVar5 = Abc_LitIsCompl(Lit_00);
      uVar11 = (ulong)uVar5 << 0x3d;
      uVar13 = 0xdfffffffffffffff;
    }
    else {
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xe0000000ffffffff | uVar11 << 0x20;
      uVar5 = Abc_LitIsCompl(Lit);
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xdfffffffffffffff | (ulong)uVar5 << 0x3d;
      iVar3 = Gia_ObjId(pGVar1,pGVar10);
      iVar4 = Abc_Lit2Var(Lit_00);
      *(ulong *)pGVar10 =
           *(ulong *)pGVar10 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
      iVar3 = Abc_LitIsCompl(Lit_00);
      uVar11 = (ulong)(uint)(iVar3 << 0x1d);
      uVar13 = 0xffffffffdfffffff;
    }
    *(ulong *)pGVar10 = uVar13 & *(ulong *)pGVar10 | uVar11;
    pGVar1->nXors = pGVar1->nXors + 1;
  }
  else {
    if (((int)Lit < 0) || (iVar3 = Abc_Lit2Var(Lit), pGVar1->nObjs <= iVar3)) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    iVar3 = Abc_Lit2Var(Lit_00);
    if (pGVar1->nObjs <= iVar3) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if (pGVar1->fGiaSimple == 0) {
      iVar3 = Abc_Lit2Var(Lit);
      iVar4 = Abc_Lit2Var(Lit_00);
      if (iVar3 == iVar4) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
    }
    iVar3 = Gia_ObjId(pGVar1,pGVar10);
    iVar4 = Abc_Lit2Var(Lit);
    uVar11 = (ulong)(iVar3 - iVar4 & 0x1fffffff);
    if (Lit < Lit_00) {
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffe0000000 | uVar11;
      iVar3 = Abc_LitIsCompl(Lit);
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
      iVar3 = Gia_ObjId(pGVar1,pGVar10);
      iVar4 = Abc_Lit2Var(Lit_00);
      *(ulong *)pGVar10 =
           *(ulong *)pGVar10 & 0xe0000000ffffffff | (ulong)(iVar3 - iVar4 & 0x1fffffff) << 0x20;
      uVar5 = Abc_LitIsCompl(Lit_00);
      uVar11 = (ulong)uVar5 << 0x3d;
      uVar13 = 0xdfffffffffffffff;
    }
    else {
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xe0000000ffffffff | uVar11 << 0x20;
      uVar5 = Abc_LitIsCompl(Lit);
      *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xdfffffffffffffff | (ulong)uVar5 << 0x3d;
      iVar3 = Gia_ObjId(pGVar1,pGVar10);
      iVar4 = Abc_Lit2Var(Lit_00);
      *(ulong *)pGVar10 =
           *(ulong *)pGVar10 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff);
      iVar3 = Abc_LitIsCompl(Lit_00);
      uVar11 = (ulong)(uint)(iVar3 << 0x1d);
      uVar13 = 0xffffffffdfffffff;
    }
    uVar15 = *(ulong *)pGVar10;
    *(ulong *)pGVar10 = uVar13 & uVar15 | uVar11;
    if (pGVar1->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar1,pGVar10 + -(uVar13 & uVar15 & 0x1fffffff),pGVar10);
      Gia_ObjAddFanout(pGVar1,pGVar10 + -((ulong)*(uint *)&pGVar10->field_0x4 & 0x1fffffff),pGVar10)
      ;
    }
    if (pGVar1->fSweeper != 0) {
      uVar13 = *(ulong *)pGVar10 & 0x1fffffff;
      uVar11 = *(ulong *)pGVar10 >> 0x20 & 0x1fffffff;
      uVar15 = 0x4000000000000000;
      uVar16 = 0x4000000000000000;
      if (((uint)*(ulong *)(pGVar10 + -uVar13) >> 0x1e & 1) == 0) {
        uVar16 = 0x40000000;
      }
      *(ulong *)(pGVar10 + -uVar13) = uVar16 | *(ulong *)(pGVar10 + -uVar13);
      uVar16 = *(ulong *)(pGVar10 + -uVar11);
      if (((uint)uVar16 >> 0x1e & 1) == 0) {
        uVar15 = 0x40000000;
      }
      *(ulong *)(pGVar10 + -uVar11) = uVar15 | uVar16;
      uVar11 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 =
           uVar11 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar11 >> 0x3d) ^ (uint)(uVar16 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pGVar10 + -uVar13) >> 0x3f) ^
                  (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
    }
    if (pGVar1->fBuiltInSim != 0) {
      uVar11 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 =
           uVar11 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar11 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pGVar10 + -(uVar11 >> 0x20 & 0x1fffffff)) >> 0x3f))
                  & ((uint)((ulong)*(undefined8 *)(pGVar10 + -(uVar11 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
      iVar3 = Gia_ObjId(pGVar1,pGVar10);
      Gia_ManBuiltInSimPerform(pGVar1,iVar3);
    }
    if (pGVar1->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(pGVar1,pGVar10);
    }
  }
  iVar3 = Gia_ObjId(pGVar1,pGVar10);
  pGVar1 = p->pGia;
  iVar4 = Abc_Lit2Var(iVar3 * 2);
  pGVar10 = Gia_ManObj(pGVar1,iVar4);
  Gia_ObjSetGateLevel(pGVar1,pGVar10);
  if (*piVar9 < 2) {
    __assert_fail("pNods[0] >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x3b9,"void Dam_ManUpdate(Dam_Man_t *, int)");
  }
  iVar4 = p->vHash->vObjs->nSize;
  p_00->nSize = 0;
  iVar12 = 0;
  for (lVar14 = 1; lVar14 <= *piVar9; lVar14 = lVar14 + 1) {
    iVar7 = Dam_ManUpdateNode(p,piVar9[lVar14],Lit,Lit_00,iVar3 * 2,p_00);
    iVar12 = iVar12 + iVar7;
  }
  uVar11 = (long)iVar4 / 4 & 0xffffffff;
  pVVar2 = p->vCounts;
  iVar4 = p->vHash->vObjs->nSize / 4;
  iVar3 = pVVar2->nSize;
  if (iVar3 < iVar4) {
    iVar7 = pVVar2->nCap * 2;
    iVar8 = iVar4;
    if ((iVar7 < iVar4) || (iVar8 = iVar7, pVVar2->nCap < iVar4)) {
      Vec_FltGrow(pVVar2,iVar8);
      iVar3 = pVVar2->nSize;
    }
    for (lVar14 = (long)iVar3; lVar14 < iVar4; lVar14 = lVar14 + 1) {
      pVVar2->pArray[lVar14] = 0.0;
    }
    pVVar2->nSize = iVar4;
  }
  local_5c = -1;
  Vec_IntFillExtra(p->vDiv2Nod,iVar4,-1);
  uVar13 = uVar11;
  while (iVar3 = (int)uVar13, iVar3 < iVar4) {
    iVar7 = Hash_IntObjData2(p->vHash,iVar3);
    if (1 < iVar7) {
      pVVar2 = p->vCounts;
      iVar8 = Hash_IntObjData0(p->vHash,iVar3);
      iLit1 = Hash_IntObjData1(p->vHash,iVar3);
      LevR = Vec_IntEntry(p->vDivLevR,iVar3);
      iVar8 = Dam_ManDivSlack(p,iVar8,iLit1,LevR);
      Vec_FltWriteEntry(pVVar2,iVar3,(float)iVar8 * 0.001 + (float)iVar7);
      Vec_QuePush(p->vQue,iVar3);
      Vec_IntWriteEntry(p->vDiv2Nod,iVar3,p->vNodStore->nSize);
      Vec_IntPush(p->vNodStore,0);
      Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar7,-1);
    }
    uVar13 = (ulong)(iVar3 + 1);
  }
  for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
    iVar7 = Vec_IntEntry(p_00,iVar3);
    if (iVar7 < 0) {
      local_5c = -iVar7;
    }
    else {
      iVar8 = Vec_IntEntry(p->vDiv2Nod,iVar7);
      if (iVar8 != -1) {
        piVar9 = Dam_DivSet(p,iVar7);
        iVar7 = *piVar9;
        *piVar9 = iVar7 + 1;
        piVar9[(long)iVar7 + 1] = local_5c;
      }
    }
  }
  do {
    iVar3 = (int)uVar11;
    if (iVar4 <= iVar3) {
      Vec_FltWriteEntry(p->vCounts,iDiv,0.0);
      p->nGain = p->nGain + ((uint)((int)Lit_00 < (int)Lit) * 2 + 1) * (iVar12 + -1);
      p->nGainX = p->nGainX + (iVar12 + -1) * (uint)((int)Lit_00 < (int)Lit) * 3;
      p->nDivs = p->nDivs + 1;
      return;
    }
    iVar7 = Vec_IntEntry(p->vDiv2Nod,iVar3);
    if (0 < iVar7) {
      piVar9 = Dam_DivSet(p,iVar3);
      iVar7 = *piVar9;
      iVar8 = Hash_IntObjData2(p->vHash,iVar3);
      if (iVar7 != iVar8) {
        __assert_fail("Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                      ,0x3e2,"void Dam_ManUpdate(Dam_Man_t *, int)");
      }
    }
    uVar11 = (ulong)(iVar3 + 1);
  } while( true );
}

Assistant:

void Dam_ManUpdate( Dam_Man_t * p, int iDiv )
{
    Vec_Int_t * vDivs = p->pGia->vSuper;
    int iLit0 = Hash_IntObjData0(p->vHash, iDiv);
    int iLit1 = Hash_IntObjData1(p->vHash, iDiv);
    int i, iLitNew, * pSet, * pNods = Dam_DivSet( p, iDiv );
    int nPresent = 0, nPairsStart, nPairsStop, pPairsNew, nRefs;
    int fThisIsXor = (iLit0 > iLit1), iDivTemp, iNode;
//    Dam_PrintQue( p );
    if ( fThisIsXor )
        iLitNew = Gia_ManAppendXorReal( p->pGia, iLit0, iLit1 );
    else
        iLitNew = Gia_ManAppendAnd( p->pGia, iLit0, iLit1 );
    Gia_ObjSetGateLevel( p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew)) );
//    printf( "%d ", Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew))) );
    // replace entries
    assert( pNods[0] >= 2 );
    nPairsStart = Hash_IntManEntryNum(p->vHash) + 1;
    Vec_IntClear( vDivs );
    for ( i = 1; i <= pNods[0]; i++ )
        nPresent += Dam_ManUpdateNode( p, pNods[i], iLit0, iLit1, iLitNew, vDivs );
    nPairsStop = Hash_IntManEntryNum(p->vHash) + 1;
    // extend arrayvs
    pPairsNew = 0;
    Vec_FltFillExtra( p->vCounts, nPairsStop, 0 );
    Vec_IntFillExtra( p->vDiv2Nod, nPairsStop, -1 );
    for ( i = nPairsStart; i < nPairsStop; i++ )
    {
        nRefs = Hash_IntObjData2(p->vHash, i);
        if ( nRefs < 2 )
            continue;
        Vec_FltWriteEntry( p->vCounts, i, nRefs + 0.001*Dam_ManDivSlack(p, Hash_IntObjData0(p->vHash, i), Hash_IntObjData1(p->vHash, i), Vec_IntEntry(p->vDivLevR, i)) );
        Vec_QuePush( p->vQue, i );
        // remember divisors
        Vec_IntWriteEntry( p->vDiv2Nod, i, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        pPairsNew++;
    }
//    printf( "Added %d new pairs\n", pPairsNew );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDivTemp, i )
    {
        if ( iDivTemp < 0 )
        {
            iNode = -iDivTemp;
            continue;
        }
        if ( Vec_IntEntry(p->vDiv2Nod, iDivTemp) == -1 )
            continue;
        pSet = Dam_DivSet( p, iDivTemp );
        pSet[++pSet[0]] = iNode;
    }
    // make sure divisors are added correctly
    for ( i = nPairsStart; i < nPairsStop; i++ )
        if ( Vec_IntEntry(p->vDiv2Nod, i) > 0 )
            assert( Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i) );
    // update costs
    Vec_FltWriteEntry( p->vCounts, iDiv, 0 );
    p->nGain += (1 + 2 * fThisIsXor) * (nPresent - 1);
    p->nGainX += 3 * fThisIsXor * (nPresent - 1);
    p->nDivs++;
}